

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O2

void __thiscall
duckdb::PatasScanState<float>::LoadGroup<false>
          (PatasScanState<float> *this,EXACT_TYPE *value_buffer)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t count;
  
  (this->group_state).index = 0;
  pdVar2 = this->metadata_ptr;
  pdVar1 = pdVar2 + -4;
  this->metadata_ptr = pdVar1;
  (this->group_state).byte_reader.buffer = this->segment_data + *(uint *)(pdVar2 + -4);
  (this->group_state).byte_reader.index = 0;
  count = this->count - this->total_value_count;
  if (0x3ff < count) {
    count = 0x400;
  }
  this->metadata_ptr = pdVar1 + -(ulong)(uint)((int)count * 2);
  PatasGroupState<unsigned_int>::LoadPackedData
            (&this->group_state,(uint16_t *)(pdVar1 + -(ulong)(uint)((int)count * 2)),count);
  PatasGroupState<unsigned_int>::LoadValues<false>(&this->group_state,value_buffer,count);
  return;
}

Assistant:

void Reset() {
		index = 0;
	}